

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfactoryloader.cpp
# Opt level: O2

MetaDataList * __thiscall
QFactoryLoader::metaData(MetaDataList *__return_storage_ptr__,QFactoryLoader *this)

{
  pointer puVar1;
  qsizetype qVar2;
  QByteArrayView input;
  bool bVar3;
  unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter> *library;
  pointer puVar4;
  long lVar5;
  QStaticPlugin *pQVar6;
  long in_FS_OFFSET;
  QLatin1StringView s;
  char *local_c8;
  QArrayDataPointer<QStaticPlugin> local_b8;
  QCborValue local_98;
  QCborValue local_80;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QPluginParsedMetaData *)0x0;
  (__return_storage_ptr__->d).size = 0;
  local_48._0_8_ = &(this->d).mutex;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QBasicMutex::lock((QBasicMutex *)local_48._0_8_);
  local_48[8] = true;
  puVar1 = (this->d).libraries.
           super__Vector_base<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>,_std::allocator<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar4 = (this->d).libraries.
                super__Vector_base<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>,_std::allocator<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar4 != puVar1; puVar4 = puVar4 + 1) {
    QList<QPluginParsedMetaData>::emplaceBack<QPluginParsedMetaData_const&>
              (__return_storage_ptr__,
               &((puVar4->_M_t).super___uniq_ptr_impl<QLibraryPrivate,_QLibraryPrivate::Deleter>.
                 _M_t.super__Tuple_impl<0UL,_QLibraryPrivate_*,_QLibraryPrivate::Deleter>.
                 super__Head_base<0UL,_QLibraryPrivate_*,_false>._M_head_impl)->metaData);
  }
  local_c8 = (this->d).iid.d.ptr;
  if (local_c8 == (char *)0x0) {
    local_c8 = &QByteArray::_empty;
  }
  qVar2 = (this->d).iid.d.size;
  local_b8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_b8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_b8.ptr = (QStaticPlugin *)&DAT_aaaaaaaaaaaaaaaa;
  QPluginLoader::staticPlugins();
  pQVar6 = local_b8.ptr;
  for (lVar5 = local_b8.size * 0x18; lVar5 != 0; lVar5 = lVar5 + -0x18) {
    input.m_size = pQVar6->rawMetaDataSize;
    input.m_data = (storage_type *)pQVar6->rawMetaData;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    QPluginParsedMetaData::QPluginParsedMetaData((QPluginParsedMetaData *)&local_68,input);
    if ((int)local_58 == 0xa0) {
      QCborValue::operator[](&local_80,(QCborValue *)&local_68,2);
      s.m_data = local_c8;
      s.m_size = qVar2;
      QCborValue::QCborValue((QCborValue *)&local_98,s);
      bVar3 = ::operator!=(&local_80,&local_98);
      QCborValue::~QCborValue((QCborValue *)&local_98);
      QCborValue::~QCborValue((QCborValue *)&local_80);
      if (!bVar3) {
        QList<QPluginParsedMetaData>::emplaceBack<QPluginParsedMetaData>
                  (__return_storage_ptr__,(QPluginParsedMetaData *)&local_68);
      }
    }
    QCborValue::~QCborValue((QCborValue *)&local_68);
    pQVar6 = pQVar6 + 1;
  }
  QArrayDataPointer<QStaticPlugin>::~QArrayDataPointer(&local_b8);
  QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QFactoryLoader::MetaDataList QFactoryLoader::metaData() const
{
    QList<QPluginParsedMetaData> metaData;
#if QT_CONFIG(library)
    QMutexLocker locker(&d->mutex);
    for (const auto &library : d->libraries)
        metaData.append(library->metaData);
#endif

    QLatin1StringView iid(d->iid.constData(), d->iid.size());
    const auto staticPlugins = QPluginLoader::staticPlugins();
    for (const QStaticPlugin &plugin : staticPlugins) {
        QByteArrayView pluginData(static_cast<const char *>(plugin.rawMetaData), plugin.rawMetaDataSize);
        QPluginParsedMetaData parsed(pluginData);
        if (parsed.isError() || parsed.value(QtPluginMetaDataKeys::IID) != iid)
            continue;
        metaData.append(std::move(parsed));
    }

    // other portions of the code will cast to int (e.g., keyMap())
    Q_ASSERT(metaData.size() <= std::numeric_limits<int>::max());
    return metaData;
}